

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TcpClient.h
# Opt level: O0

TcpClient * __thiscall Liby::TcpClient::setEventLoop(TcpClient *this,EventLoop *loop)

{
  Poller *pPVar1;
  bool bVar2;
  EventLoop *loop_local;
  TcpClient *this_local;
  
  bVar2 = false;
  if (loop != (EventLoop *)0x0) {
    pPVar1 = EventLoop::getPoller(loop);
    bVar2 = pPVar1 != (Poller *)0x0;
  }
  if (!bVar2) {
    __assert_fail("loop && loop->getPoller()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ccsexyz[P]liby-cpp/src/TcpClient.h"
                  ,0x19,"TcpClient &Liby::TcpClient::setEventLoop(EventLoop *)");
  }
  this->loop_ = loop;
  pPVar1 = EventLoop::getPoller(loop);
  this->poller_ = pPVar1;
  return this;
}

Assistant:

TcpClient &setEventLoop(EventLoop *loop) {
        assert(loop && loop->getPoller());
        loop_ = loop;
        poller_ = loop->getPoller();
        return *this;
    }